

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void SanitizeFormatString(char *fmt,char *fmt_out,size_t fmt_out_size)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  char c;
  char *fmt_end;
  char *local_10;
  char *local_8;
  
  pcVar2 = ImParseFormatFindEnd(in_RDI);
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (local_8 < pcVar2) {
    pcVar3 = local_8 + 1;
    cVar1 = *local_8;
    local_8 = pcVar3;
    if (((cVar1 != '\'') && (cVar1 != '$')) && (cVar1 != '_')) {
      *local_10 = cVar1;
      local_10 = local_10 + 1;
    }
  }
  *local_10 = '\0';
  return;
}

Assistant:

static void SanitizeFormatString(const char* fmt, char* fmt_out, size_t fmt_out_size)
{
    IM_UNUSED(fmt_out_size);
    const char* fmt_end = ImParseFormatFindEnd(fmt);
    IM_ASSERT((size_t)(fmt_end - fmt + 1) < fmt_out_size); // Format is too long, let us know if this happens to you!
    while (fmt < fmt_end)
    {
        char c = *(fmt++);
        if (c != '\'' && c != '$' && c != '_') // Custom flags provided by stb_sprintf.h. POSIX 2008 also supports '.
            *(fmt_out++) = c;
    }
    *fmt_out = 0; // Zero-terminate
}